

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::saveFreqMapBinary(char *fname,TFreqMap *freqMap)

{
  TProb *pTVar1;
  _Base_ptr p_Var2;
  mapped_type_conflict *pmVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  uint8_t n_1;
  uint8_t d;
  int local_280;
  int local_27c;
  vector<int,_std::allocator<int>_> keys;
  int32_t n;
  _Rb_tree_node_base local_258;
  ofstream fout;
  int aiStack_210 [120];
  
  std::ofstream::ofstream(&fout,fname,_S_bin);
  iVar5 = *(int *)((long)aiStack_210 + *(long *)(_fout + -0x18));
  if (iVar5 == 0) {
    std::ostream::write((char *)&fout,(long)freqMap);
    std::ostream::write((char *)&fout,(long)&freqMap->nTotal);
    pTVar1 = &freqMap->pmin;
    std::ostream::write((char *)&fout,(long)pTVar1);
    n = (int32_t)(freqMap->prob)._M_h._M_element_count;
    std::ostream::write((char *)&fout,(long)&n);
    std::map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>>::
    map<std::__detail::_Node_const_iterator<std::pair<int_const,float>,false,false>>
              ((map<int,float,std::less<int>,std::allocator<std::pair<int_const,float>>> *)&n,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)
               (freqMap->prob)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<std::pair<const_int,_float>,_false,_false>)0x0);
    keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    for (p_Var2 = local_258._M_left; p_Var2 != &local_258;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if ((*(float *)&p_Var2[1].field_0x4 != *pTVar1) ||
         (NAN(*(float *)&p_Var2[1].field_0x4) || NAN(*pTVar1))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&keys,(value_type_conflict1 *)(p_Var2 + 1));
      }
    }
    iVar8 = 0;
    local_27c = iVar5;
    while (iVar8 < (int)((ulong)((long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2)) {
      uVar6 = (ulong)iVar8;
      std::ostream::write((char *)&fout,
                          (long)(keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar6));
      pmVar3 = std::map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
               operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                           *)&n,keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar6);
      std::ostream::write((char *)&fout,(long)pmVar3);
      iVar5 = (int)((ulong)((long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      if (iVar8 == iVar5 + -1) break;
      iVar10 = iVar8 + 1;
      lVar11 = 0;
      do {
        iVar4 = (int)lVar11;
        if (0xff < keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6 + lVar11 + 1] -
                   keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6 + lVar11]) goto LAB_001187d6;
        lVar7 = lVar11 + 1;
      } while (((iVar5 - iVar8) + -2 != iVar4) &&
              (bVar12 = ~uVar6 + (long)(iVar8 + 0xfe) != lVar11, lVar11 = lVar7, bVar12));
      iVar4 = (int)lVar7;
LAB_001187d6:
      local_280 = iVar8 + iVar4 + 1;
      n_1 = ~(byte)iVar8 + (char)local_280;
      std::ostream::write((char *)&fout,(long)&n_1);
      iVar8 = local_280;
      if (n_1 != '\0') {
        lVar9 = (long)iVar10;
        lVar7 = (long)local_280;
        lVar11 = lVar9 * 4;
        for (; iVar8 = local_280, lVar9 < lVar7; lVar9 = lVar9 + 1) {
          d = (char)*(undefined4 *)
                     ((long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar11) -
              (char)*(undefined4 *)
                     ((long)keys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar11 + -4);
          std::ostream::write((char *)&fout,(long)&d);
          pmVar3 = std::
                   map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>::
                   operator[]((map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                               *)&n,(key_type *)
                                    ((long)keys.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar11));
          std::ostream::write((char *)&fout,(long)pmVar3);
          lVar11 = lVar11 + 4;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&keys.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_float>,_std::_Select1st<std::pair<const_int,_float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_>
                 *)&n);
    iVar5 = local_27c;
  }
  else {
    printf("    Failed to open file \'%s\'\n",fname);
  }
  std::ofstream::~ofstream(&fout);
  return iVar5 == 0;
}

Assistant:

bool saveFreqMapBinary(const char * fname, const TFreqMap & freqMap) {
        std::ofstream fout(fname, std::ios::binary);
        if (fout.good() == false) {
            printf("    Failed to open file '%s'\n", fname);
            return false;
        }

        fout.write((const char *) &freqMap.len,    sizeof(freqMap.len));
        fout.write((const char *) &freqMap.nTotal, sizeof(freqMap.nTotal));
        fout.write((const char *) &freqMap.pmin,   sizeof(freqMap.pmin));

        { int32_t n = freqMap.prob.size(); fout.write((const char *) &n, sizeof(n)); }

        {
            std::map<TCode, TProb> sorted(freqMap.prob.begin(), freqMap.prob.end());

            std::vector<TCode> keys;
            for (const auto & [i, p] : sorted) {
                if (p == freqMap.pmin) {
                    continue;
                }
                keys.push_back(i);
            }

            int32_t is = 0;
            while (is < (int) keys.size()) {
                fout.write((const char *) &keys[is],         sizeof(keys[is]));
                fout.write((const char *) &sorted[keys[is]], sizeof(sorted[keys[is]]));

                if (is == (int) keys.size() - 1) break;

                int32_t ie = is + 1;
                while (keys[ie] - keys[ie - 1] < 256) {
                    ++ie;
                    if (ie == (int) keys.size()) break;
                    if (ie == is + 255) break;
                }

                uint8_t n = (uint8_t) (ie - is - 1);
                fout.write((const char *) &n, sizeof(n));
                if (n > 0) {
                    for (int i = is + 1; i < ie; ++i) {
                        uint8_t d = (uint8_t) (keys[i] - keys[i - 1]);
                        fout.write((const char *) &d,               sizeof(d));
                        fout.write((const char *) &sorted[keys[i]], sizeof(sorted[keys[i]]));
                    }
                }

                is = ie;
            }
        }

        return true;
    }